

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall NominalTest_TestIterSubTypes_Test::TestBody(NominalTest_TestIterSubTypes_Test *this)

{
  allocator<wasm::HeapType> *this_00;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_00;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_01;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_02;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_03;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_04;
  initializer_list<std::pair<wasm::HeapType,_unsigned_int>_> __l_05;
  initializer_list<wasm::HeapType> __l_06;
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar3;
  char *in_R9;
  AssertHelper local_860;
  Message local_858;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_84b;
  key_equal local_84a;
  hasher local_849;
  int local_848 [2];
  pair<wasm::HeapType,_unsigned_int> local_840;
  pair<wasm::HeapType,_unsigned_int> local_830;
  iterator local_820;
  size_type local_818;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_810;
  uintptr_t local_7d8;
  TypeDepths local_7d0;
  undefined1 local_798 [8];
  AssertionResult gtest_ar_6;
  Message local_780;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_773;
  key_equal local_772;
  hasher local_771;
  int local_770 [2];
  pair<wasm::HeapType,_unsigned_int> local_768;
  pair<wasm::HeapType,_unsigned_int> local_758;
  iterator local_748;
  size_type local_740;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_738;
  uintptr_t local_700;
  TypeDepths local_6f8;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_5;
  Message local_6a8;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_69f;
  key_equal local_69e;
  hasher local_69d;
  int local_69c;
  pair<wasm::HeapType,_unsigned_int> local_698;
  iterator local_688;
  size_type local_680;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_678;
  uintptr_t local_640;
  TypeDepths local_638;
  undefined1 local_600 [8];
  AssertionResult gtest_ar_4;
  Message local_5e8;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_5db;
  key_equal local_5da;
  hasher local_5d9;
  int local_5d8 [4];
  pair<wasm::HeapType,_unsigned_int> local_5c8;
  pair<wasm::HeapType,_unsigned_int> local_5b8;
  pair<wasm::HeapType,_unsigned_int> local_5a8;
  pair<wasm::HeapType,_unsigned_int> local_598;
  iterator local_588;
  size_type local_580;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_578;
  uintptr_t local_540;
  TypeDepths local_538;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_3;
  Message local_4e8;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_4db;
  key_equal local_4da;
  hasher local_4d9;
  int local_4d8 [4];
  pair<wasm::HeapType,_unsigned_int> local_4c8;
  pair<wasm::HeapType,_unsigned_int> local_4b8;
  pair<wasm::HeapType,_unsigned_int> local_4a8;
  pair<wasm::HeapType,_unsigned_int> local_498;
  iterator local_488;
  size_type local_480;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_478;
  uintptr_t local_440;
  TypeDepths local_438;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_2;
  Message local_3e8;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_3df;
  key_equal local_3de;
  hasher local_3dd;
  int local_3dc [3];
  pair<wasm::HeapType,_unsigned_int> local_3d0;
  pair<wasm::HeapType,_unsigned_int> local_3c0;
  pair<wasm::HeapType,_unsigned_int> local_3b0;
  iterator local_3a0;
  size_type local_398;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_390;
  uintptr_t local_358;
  TypeDepths local_350;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_1;
  Message local_300;
  allocator<std::pair<wasm::HeapType,_unsigned_int>_> local_2f7;
  key_equal local_2f6;
  hasher local_2f5;
  int local_2f4;
  pair<wasm::HeapType,_unsigned_int> local_2f0;
  iterator local_2e0;
  size_type local_2d8;
  unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
  local_2d0;
  uintptr_t local_298;
  TypeDepths local_290;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  anon_class_8_1_6b5fb797 getSubTypes;
  HeapType local_238;
  uintptr_t local_230;
  uintptr_t local_228;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_220;
  iterator local_218;
  size_type local_210;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_208;
  undefined1 local_1f0 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_108;
  Struct local_f8;
  Entry local_d8;
  Struct local_c8;
  Entry local_a8;
  Struct local_98 [2];
  Entry local_68;
  Struct local_58;
  TypeBuilder local_38;
  TypeBuilder builder;
  HeapType D;
  HeapType C;
  HeapType B;
  HeapType A;
  NominalTest_TestIterSubTypes_Test *this_local;
  
  wasm::HeapType::HeapType(&B);
  wasm::HeapType::HeapType(&C);
  wasm::HeapType::HeapType(&D);
  wasm::HeapType::HeapType((HeapType *)&builder);
  wasm::TypeBuilder::TypeBuilder(&local_38,4);
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_58);
  local_68 = wasm::TypeBuilder::operator[](&local_38,0);
  wasm::TypeBuilder::Entry::operator=(&local_68,&local_58);
  wasm::Struct::~Struct(&local_58);
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(local_98);
  local_a8 = wasm::TypeBuilder::operator[](&local_38,1);
  wasm::TypeBuilder::Entry::operator=(&local_a8,local_98);
  wasm::Struct::~Struct(local_98);
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_c8);
  local_d8 = wasm::TypeBuilder::operator[](&local_38,2);
  wasm::TypeBuilder::Entry::operator=(&local_d8,&local_c8);
  wasm::Struct::~Struct(&local_c8);
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_f8);
  local_108 = wasm::TypeBuilder::operator[](&local_38,3);
  wasm::TypeBuilder::Entry::operator=(&local_108,&local_f8);
  wasm::Struct::~Struct(&local_f8);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  wasm::TypeBuilder::setSubType((ulong)&local_38,(HeapType)0x1);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  wasm::TypeBuilder::setSubType((ulong)&local_38,(HeapType)0x2);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_38);
  wasm::TypeBuilder::setSubType((ulong)&local_38,(HeapType)0x3);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_150,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_150,(AssertionResult *)"result","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x454,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  if (bVar1) {
    __x = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,__x);
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,0);
    B.id = pvVar3->id;
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,1);
    C.id = pvVar3->id;
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,2);
    D.id = pvVar3->id;
    pvVar3 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,3);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar3->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_38);
  if (bVar1) {
    local_238.id = B.id;
    local_230 = C.id;
    local_228 = D.id;
    local_220._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_218 = &local_238;
    local_210 = 4;
    this_00 = (allocator<wasm::HeapType> *)((long)&getSubTypes.subTypes + 7);
    std::allocator<wasm::HeapType>::allocator(this_00);
    __l_06._M_len = local_210;
    __l_06._M_array = local_218;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_208,__l_06,this_00);
    wasm::SubTypes::SubTypes((SubTypes *)local_1f0,&local_208);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_208);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&getSubTypes.subTypes + 7));
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_1f0;
    local_298 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_290,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,0);
    local_2f4 = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_2f0,&B,&local_2f4);
    local_2e0 = &local_2f0;
    local_2d8 = 1;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_2f7);
    __l_05._M_len = local_2d8;
    __l_05._M_array = local_2e0;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_2d0,__l_05,0,&local_2f5,&local_2f6,&local_2f7);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_258,"getSubTypes(A, 0)","TypeDepths({{A, 0}})",&local_290,
               &local_2d0);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_2d0);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_2f7);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_290);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_300);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x469,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_300);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_300);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    local_358 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_350,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,1);
    local_3dc[2] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_3d0,&B,local_3dc + 2);
    local_3dc[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_3c0,&C,local_3dc + 1);
    local_3dc[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_3b0,&D,local_3dc);
    local_3a0 = &local_3d0;
    local_398 = 3;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_3df);
    __l_04._M_len = local_398;
    __l_04._M_array = local_3a0;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_390,__l_04,0,&local_3dd,&local_3de,&local_3df);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_318,"getSubTypes(A, 1)","TypeDepths({{A, 0}, {B, 1}, {C, 1}})",
               &local_350,&local_390);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_390);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_3df);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_350);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
    if (!bVar1) {
      testing::Message::Message(&local_3e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46a,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_3e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
    local_440 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_438,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,2);
    local_4d8[3] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_4c8,&B,local_4d8 + 3);
    local_4d8[2] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_4b8,&C,local_4d8 + 2);
    local_4d8[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_4a8,&D,local_4d8 + 1);
    local_4d8[0] = 2;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_498,(HeapType *)&builder,local_4d8);
    local_488 = &local_4c8;
    local_480 = 4;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_4db);
    __l_03._M_len = local_480;
    __l_03._M_array = local_488;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_478,__l_03,0,&local_4d9,&local_4da,&local_4db);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_400,"getSubTypes(A, 2)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",&local_438,&local_478);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_478);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_4db);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_438);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
    if (!bVar1) {
      testing::Message::Message(&local_4e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46b,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_4e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_4e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
    local_540 = B.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_538,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,B,3);
    local_5d8[3] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_5c8,&B,local_5d8 + 3);
    local_5d8[2] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_5b8,&C,local_5d8 + 2);
    local_5d8[1] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_5a8,&D,local_5d8 + 1);
    local_5d8[0] = 2;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_598,(HeapType *)&builder,local_5d8);
    local_588 = &local_5c8;
    local_580 = 4;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_5db);
    __l_02._M_len = local_580;
    __l_02._M_array = local_588;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_578,__l_02,0,&local_5d9,&local_5da,&local_5db);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_500,"getSubTypes(A, 3)",
               "TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}})",&local_538,&local_578);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_578);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_5db);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_538);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar1) {
      testing::Message::Message(&local_5e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46c,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_5e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_5e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    local_640 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_638,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,0);
    local_69c = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_698,&D,&local_69c);
    local_688 = &local_698;
    local_680 = 1;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_69f);
    __l_01._M_len = local_680;
    __l_01._M_array = local_688;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_678,__l_01,0,&local_69d,&local_69e,&local_69f);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_600,"getSubTypes(C, 0)","TypeDepths({{C, 0}})",&local_638,
               &local_678);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_678);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_69f);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_638);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
    if (!bVar1) {
      testing::Message::Message(&local_6a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_600);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_6a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_6a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_600);
    local_700 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_6f8,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,1);
    local_770[1] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_768,&D,local_770 + 1);
    local_770[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_758,(HeapType *)&builder,local_770);
    local_748 = &local_768;
    local_740 = 2;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_773);
    __l_00._M_len = local_740;
    __l_00._M_array = local_748;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_738,__l_00,0,&local_771,&local_772,&local_773);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_6c0,"getSubTypes(C, 1)","TypeDepths({{C, 0}, {D, 1}})",&local_6f8,
               &local_738);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_738);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_773);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_6f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
    if (!bVar1) {
      testing::Message::Message(&local_780);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x46f,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_780);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_780);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
    local_7d8 = D.id;
    TestBody::anon_class_8_1_6b5fb797::operator()
              (&local_7d0,(anon_class_8_1_6b5fb797 *)&gtest_ar.message_,D,2);
    local_848[1] = 0;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_840,&D,local_848 + 1);
    local_848[0] = 1;
    std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_int,_true>
              (&local_830,(HeapType *)&builder,local_848);
    local_820 = &local_840;
    local_818 = 2;
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::allocator(&local_84b);
    __l._M_len = local_818;
    __l._M_array = local_820;
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::unordered_set(&local_810,__l,0,&local_849,&local_84a,&local_84b);
    testing::internal::EqHelper::
    Compare<std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_std::unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>,_nullptr>
              ((EqHelper *)local_798,"getSubTypes(C, 2)","TypeDepths({{C, 0}, {D, 1}})",&local_7d0,
               &local_810);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_810);
    std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>::~allocator(&local_84b);
    std::
    unordered_set<std::pair<wasm::HeapType,_unsigned_int>,_std::hash<std::pair<wasm::HeapType,_unsigned_int>_>,_std::equal_to<std::pair<wasm::HeapType,_unsigned_int>_>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_set(&local_7d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
    if (!bVar1) {
      testing::Message::Message(&local_858);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
      testing::internal::AssertHelper::AssertHelper
                (&local_860,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x470,pcVar2);
      testing::internal::AssertHelper::operator=(&local_860,&local_858);
      testing::internal::AssertHelper::~AssertHelper(&local_860);
      testing::Message::~Message(&local_858);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
    wasm::SubTypes::~SubTypes((SubTypes *)local_1f0);
  }
  return;
}

Assistant:

TEST_F(NominalTest, TestIterSubTypes) {
  /*
        A
       / \
      B   C
           \
            D
  */
  HeapType A, B, C, D;
  {
    TypeBuilder builder(4);
    builder[0] = Struct();
    builder[1] = Struct();
    builder[2] = Struct();
    builder[3] = Struct();
    builder.setSubType(1, builder.getTempHeapType(0));
    builder.setSubType(2, builder.getTempHeapType(0));
    builder.setSubType(3, builder.getTempHeapType(2));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
    D = built[3];
  }

  SubTypes subTypes({A, B, C, D});

  // Helper for comparing sets of types + their corresponding depth.
  using TypeDepths = std::unordered_set<std::pair<HeapType, Index>>;

  auto getSubTypes = [&](HeapType type, Index depth) {
    TypeDepths ret;
    subTypes.iterSubTypes(type, depth, [&](HeapType subType, Index depth) {
      ret.insert({subType, depth});
    });
    return ret;
  };

  EXPECT_EQ(getSubTypes(A, 0), TypeDepths({{A, 0}}));
  EXPECT_EQ(getSubTypes(A, 1), TypeDepths({{A, 0}, {B, 1}, {C, 1}}));
  EXPECT_EQ(getSubTypes(A, 2), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));
  EXPECT_EQ(getSubTypes(A, 3), TypeDepths({{A, 0}, {B, 1}, {C, 1}, {D, 2}}));

  EXPECT_EQ(getSubTypes(C, 0), TypeDepths({{C, 0}}));
  EXPECT_EQ(getSubTypes(C, 1), TypeDepths({{C, 0}, {D, 1}}));
  EXPECT_EQ(getSubTypes(C, 2), TypeDepths({{C, 0}, {D, 1}}));
}